

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O3

void client_once(int operation)

{
  int signal_number;
  sigaction signal_action;
  int local_a4;
  sigaction local_a0;
  
  setup_signals(&local_a0,2);
  usleep(1000);
  if (operation == 0) {
    sigwait((sigset_t *)&local_a0.sa_mask,&local_a4);
  }
  else {
    kill(0,10);
  }
  return;
}

Assistant:

void client_once(int operation) {
	struct sigaction signal_action;
	setup_client_signals(&signal_action);
	if (operation == WAIT) {
		wait_for_signal(&signal_action);
	} else {
		notify_server();
	}
}